

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

MainFunc __thiscall kj::MainBuilder::build(MainBuilder *this)

{
  char *pcVar1;
  size_t sVar2;
  Impl *pIVar3;
  Iface *extraout_RDX;
  Impl *ptrCopy;
  undefined8 *in_RSI;
  MainFunc MVar4;
  
  pcVar1 = (char *)*in_RSI;
  sVar2 = in_RSI[1];
  in_RSI[1] = 0;
  pIVar3 = (Impl *)operator_new(0x18);
  pIVar3->context = (ProcessContext *)&PTR_operator___00211bb8;
  (pIVar3->version).content.ptr = pcVar1;
  (pIVar3->version).content.size_ = sVar2;
  (this->impl).disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>::Impl<kj::MainBuilder::MainImpl>>
        ::instance;
  (this->impl).ptr = pIVar3;
  MVar4.impl.ptr = extraout_RDX;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

MainFunc MainBuilder::build() {
  return MainImpl(kj::mv(impl));
}